

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O3

void __thiscall
boost::lockfree::detail::
runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
::
runtime_sized_freelist_storage<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
          (runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
           *this,allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
                 *alloc,size_t count)

{
  pointer pvVar1;
  runtime_error arStack_18 [16];
  
  *(size_t *)(this + 8) = count;
  if (count < 0x10000) {
    pvVar1 = alignment::
             aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
             ::allocate((aligned_allocator_adaptor<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>,_64UL>
                         *)this,count);
    *(pointer *)this = pvVar1;
    return;
  }
  std::runtime_error::runtime_error
            (arStack_18,"boost.lockfree: freelist size is limited to a maximum of 65535 objects");
  throw_exception<std::runtime_error>(arStack_18);
}

Assistant:

runtime_sized_freelist_storage(Allocator const & alloc, std::size_t count):
        allocator_type(alloc), node_count_(count)
    {
        if (count > 65535)
            boost::throw_exception(std::runtime_error("boost.lockfree: freelist size is limited to a maximum of 65535 objects"));
        nodes_ = allocator_type::allocate(count);
    }